

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::IsGreaterThanOrEqualTo(IntBounds *this,Value *value,int offset)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  bool local_51;
  ValueNumber local_44;
  ValueRelativeOffset *local_40;
  ValueRelativeOffset *bound;
  bool success;
  ValueInfo *pVStack_30;
  int constantBoundBase;
  ValueInfo *valueInfo;
  Value *pVStack_20;
  int offset_local;
  Value *value_local;
  IntBounds *this_local;
  
  valueInfo._4_4_ = offset;
  pVStack_20 = value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x156,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pVStack_30 = ::Value::GetValueInfo(pVStack_20);
  bound._4_4_ = 0x7fffffff;
  bound._3_1_ = ValueInfo::TryGetIntConstantUpperBound(pVStack_30,(int32 *)((long)&bound + 4),true);
  if (!(bool)bound._3_1_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x15b,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IsGreaterThanOrEqualTo(this,bound._4_4_,valueInfo._4_4_);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = ValueInfo::HasIntConstantValue(pVStack_30,false);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      local_44 = ::Value::GetValueNumber(pVStack_20);
      bVar2 = JsUtil::
              BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::TryGetReference<unsigned_int>
                        (&(this->relativeLowerBounds).
                          super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         ,&local_44,&local_40);
      local_51 = false;
      if (bVar2) {
        iVar3 = ValueRelativeOffset::Offset(local_40);
        local_51 = valueInfo._4_4_ <= iVar3;
      }
      this_local._7_1_ = local_51;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const Value *const value, const int offset) const
{
    Assert(value);

    ValueInfo const * const valueInfo = value->GetValueInfo();
    int constantBoundBase = INT32_MAX;
    const bool success = valueInfo->TryGetIntConstantUpperBound(&constantBoundBase, true);
    Assert(success);
    if(IsGreaterThanOrEqualTo(constantBoundBase, offset))
        return true;

    if(valueInfo->HasIntConstantValue())
        return false;

    const ValueRelativeOffset *bound;
    return relativeLowerBounds.TryGetReference(value->GetValueNumber(), &bound) && bound->Offset() >= offset;
}